

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O0

void add_udp_socket(socket_server *ss,request_udp *udp)

{
  uint id_00;
  socket *psVar1;
  socket *ns;
  int protocol;
  int id;
  request_udp *udp_local;
  socket_server *ss_local;
  
  id_00 = udp->id;
  if (udp->family == 10) {
    ns._0_4_ = 2;
  }
  else {
    ns._0_4_ = 1;
  }
  psVar1 = new_fd(ss,id_00,udp->fd,(int)ns,udp->opaque,true);
  if (psVar1 == (socket *)0x0) {
    close(udp->fd);
    ss->slot[id_00 & 0xffff].type = 0;
  }
  else {
    psVar1->type = 5;
    memset(&psVar1->p,0,0x13);
  }
  return;
}

Assistant:

static void
add_udp_socket(struct socket_server *ss, struct request_udp *udp) {
	int id = udp->id;
	int protocol;
	if (udp->family == AF_INET6) {
		protocol = PROTOCOL_UDPv6;
	} else {
		protocol = PROTOCOL_UDP;
	}
	struct socket *ns = new_fd(ss, id, udp->fd, protocol, udp->opaque, true);
	if (ns == NULL) {
		close(udp->fd);
		ss->slot[HASH_ID(id)].type = SOCKET_TYPE_INVALID;
		return;
	}
	ns->type = SOCKET_TYPE_CONNECTED;
	memset(ns->p.udp_address, 0, sizeof(ns->p.udp_address));
}